

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.cpp
# Opt level: O0

void __thiscall gui::Timer::setCallback(Timer *this,function<void_(gui::Timer_*)> *callback)

{
  Callback<gui::Timer_*> *in_RDI;
  Callback<gui::Timer_*> *in_stack_ffffffffffffff98;
  function<void_(gui::Timer_*)> *in_stack_ffffffffffffffa8;
  function<void_(gui::Timer_*)> *in_stack_ffffffffffffffb0;
  
  std::function<void_(gui::Timer_*)>::function(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  Callback<gui::Timer_*>::Callback
            (in_RDI,(function<void_(gui::Timer_*)> *)in_stack_ffffffffffffff98);
  Callback<gui::Timer_*>::operator=(in_RDI,in_stack_ffffffffffffff98);
  Callback<gui::Timer_*>::~Callback(in_RDI);
  std::function<void_(gui::Timer_*)>::~function((function<void_(gui::Timer_*)> *)0x22b369);
  return;
}

Assistant:

void Timer::setCallback(const std::function<void(Timer*)>& callback) {
    callback_ = callback;
}